

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table_visitor.cpp
# Opt level: O1

void __thiscall symbol_table_visitor::visit(symbol_table_visitor *this,FieldInvocation *ptr)

{
  pointer ppVVar1;
  pointer ppVVar2;
  string *psVar3;
  size_t sVar4;
  VariableSymbol *pVVar5;
  size_t __n;
  int iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  bool bVar7;
  pointer ppVVar8;
  bool bVar9;
  
  ppVVar1 = (this->curr_class->fields).
            super__Vector_base<VariableSymbol_*,_std::allocator<VariableSymbol_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppVVar2 = (this->curr_class->fields).
            super__Vector_base<VariableSymbol_*,_std::allocator<VariableSymbol_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppVVar1 != ppVVar2) {
    psVar3 = ptr->name;
    sVar4 = psVar3->_M_string_length;
    bVar7 = false;
    do {
      ppVVar8 = ppVVar1 + 1;
      pVVar5 = *ppVVar1;
      __n = (pVVar5->super_BaseSymbol).name._M_string_length;
      if (__n == sVar4) {
        if (__n == 0) {
          bVar9 = true;
        }
        else {
          iVar6 = bcmp((pVVar5->super_BaseSymbol).name._M_dataplus._M_p,(psVar3->_M_dataplus)._M_p,
                       __n);
          bVar9 = iVar6 == 0;
        }
      }
      else {
        bVar9 = false;
      }
      if (bVar9) {
        ptr->type = pVVar5->type;
        bVar7 = true;
      }
      ppVVar1 = ppVVar8;
    } while (!(bool)(bVar9 | ppVVar8 == ppVVar2));
    if (bVar7) {
      return;
    }
  }
  __return_storage_ptr__ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       __cxa_allocate_exception(0x20);
  std::operator+(__return_storage_ptr__,"syntax error: can\'t find field ",ptr->name);
  __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void symbol_table_visitor::visit(FieldInvocation* ptr) {
    bool field_exists = false;
    for(auto field : curr_class->fields) {
        if (field->name == *ptr->name) {
            field_exists = true;
            ptr->type = field->type;
            break;
        }
    }
    if (!field_exists) {
        throw "syntax error: can't find field " + *ptr->name;
    }
    //name
}